

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O2

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>,0ul,1ul,2ul,3ul>
               (ostream *os,exception_ptr_error *t)

{
  std::operator<<(os,(char *)t[3].m_exception._M_exception_object);
  std::operator<<(os,(char *)t[2].m_exception._M_exception_object);
  std::operator<<(os,(char *)t[1].m_exception._M_exception_object);
  has_exceptions::operator<<(os,t);
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}